

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2dcf93::SizeofParamPackExpr::printLeft(SizeofParamPackExpr *this,OutputStream *S)

{
  ParameterPackExpansion local_28;
  
  OutputStream::grow(S,10);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"sizeof...(",10);
  S->CurrentPosition = S->CurrentPosition + 10;
  local_28.Child = this->Pack;
  local_28.super_Node.K = KParameterPackExpansion;
  local_28.super_Node.RHSComponentCache = No;
  local_28.super_Node.ArrayCache = No;
  local_28.super_Node.FunctionCache = No;
  local_28.super_Node._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001cfab8;
  ParameterPackExpansion::printLeft(&local_28,S);
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "sizeof...(";
    ParameterPackExpansion PPE(Pack);
    PPE.printLeft(S);
    S += ")";
  }